

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

int jsonnet::internal::whitespace_check(char *a,char *b)

{
  char cVar1;
  int i;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    cVar1 = a[lVar2];
    if ((cVar1 != ' ') && (cVar1 != '\t')) goto LAB_001b0c06;
    if (b[lVar2] != cVar1) break;
    lVar2 = lVar2 + 1;
  }
  lVar2 = 0;
LAB_001b0c06:
  return (int)lVar2;
}

Assistant:

static int whitespace_check(const char *a, const char *b)
{
    int i = 0;
    while (a[i] == ' ' || a[i] == '\t') {
        if (b[i] != a[i])
            return 0;
        i++;
    }
    return i;
}